

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

SampledSpectrum __thiscall
pbrt::MarbleTexture::Evaluate(MarbleTexture *this,TextureEvalContext ctx,SampledWavelengths lambda)

{
  float fVar1;
  undefined1 auVar2 [16];
  int iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar16 [56];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  Float FVar17;
  undefined1 auVar18 [16];
  undefined1 in_register_000012c4 [12];
  Point3f PVar19;
  RGB RVar20;
  SampledSpectrum SVar21;
  undefined8 *local_128;
  Float local_120;
  undefined8 *local_118;
  float local_110;
  undefined1 local_108 [16];
  RGB *local_f8;
  RGB local_e8;
  RGB local_d8;
  undefined8 local_c8;
  float local_c0;
  undefined8 local_b8;
  float local_b0;
  undefined1 local_a8 [16];
  undefined8 uStack_98;
  undefined1 auStack_90 [16];
  undefined8 uStack_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined4 local_40;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  local_118 = &local_b8;
  local_128 = &local_c8;
  local_108._0_8_ = local_a8;
  local_108._8_8_ = &local_118;
  local_f8 = (RGB *)&local_128;
  local_b8 = 0;
  local_c8 = 0;
  local_b0 = 0.0;
  local_c0 = 0.0;
  local_a8._0_4_ = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
  local_a8._4_4_ = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
  local_a8._8_4_ = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
  local_a8._12_4_ = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
  uStack_98._0_4_ = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_98._4_4_ = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
  auStack_90._0_4_ = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
  auStack_90._4_4_ = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
  auStack_90._8_4_ = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
  auStack_90._12_4_ = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
  uStack_80._0_4_ = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
  uStack_80._4_4_ = ctx.dudx;
  uStack_78._0_4_ = ctx.dudy;
  uStack_78._4_4_ = ctx.dvdx;
  uStack_70._0_4_ = ctx.dvdy;
  uStack_70._4_4_ = ctx.faceIndex;
  PVar19 = const::{lambda(auto:1)#1}::operator()
                     ((_lambda_auto_1__1_ *)local_108,
                      (TransformMapping3D *)
                      ((this->mapping).super_TaggedPointer<pbrt::TransformMapping3D>.bits &
                      0xffffffffffff));
  fVar1 = this->scale;
  auVar4._0_4_ = fVar1 * PVar19.super_Tuple3<pbrt::Point3,_float>.x;
  auVar4._4_4_ = fVar1 * PVar19.super_Tuple3<pbrt::Point3,_float>.y;
  auVar4._8_4_ = fVar1 * ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
  auVar4._12_4_ = fVar1 * ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
  local_118 = (undefined8 *)vmovlps_avx(auVar4);
  local_110 = PVar19.super_Tuple3<pbrt::Point3,_float>.z * fVar1;
  FVar17 = this->variation;
  auVar5._0_4_ = fVar1 * (float)local_b8;
  auVar5._4_4_ = fVar1 * (float)((ulong)local_b8 >> 0x20);
  auVar5._8_4_ = fVar1 * 0.0;
  auVar5._12_4_ = fVar1 * 0.0;
  local_a8._0_8_ = vmovlps_avx(auVar5);
  local_a8._8_4_ = fVar1 * local_b0;
  auVar6._0_4_ = fVar1 * (float)local_c8;
  auVar6._4_4_ = fVar1 * (float)((ulong)local_c8 >> 0x20);
  auVar6._8_4_ = fVar1 * 0.0;
  auVar6._12_4_ = fVar1 * 0.0;
  local_108._0_8_ = vmovlps_avx(auVar6);
  local_108._8_4_ = fVar1 * local_c0;
  auVar8._0_4_ = FBm((Point3f *)&local_118,(Vector3f *)local_a8,(Vector3f *)local_108,this->omega,
                     this->octaves);
  auVar8._4_60_ = extraout_var;
  auVar4 = vmovshdup_avx(auVar4);
  auVar4 = vfmadd132ss_fma(auVar8._0_16_,auVar4,ZEXT416((uint)FVar17));
  auVar9._0_4_ = sinf(auVar4._0_4_);
  auVar9._4_60_ = extraout_var_00;
  auVar5 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3f000000),0),auVar9._0_16_,
                           SUB6416(ZEXT464(0x3f000000),0));
  local_a8._0_4_ = 0.58;
  local_a8._4_4_ = 0.58;
  local_a8._8_8_ = 0x3f147ae13f19999a;
  uStack_98 = 0x3f19999a3f147ae1;
  auStack_90._0_8_ = 0x3f147ae13f147ae1;
  auStack_90._8_8_ = 0x3f0000003f19999a;
  uStack_80 = 0x3f0000003f000000;
  uStack_78 = 0x3f170a3d3f19999a;
  uStack_70 = 0x3f147ae13f147ae1;
  local_68 = 0x3f19999a3f147ae1;
  uStack_60 = 0x3f147ae13f147ae1;
  uStack_58 = 0x3e4ccccd3f19999a;
  uStack_50 = 0x3ea8f5c33e4ccccd;
  auVar7._8_4_ = 0x3f147ae1;
  auVar7._0_8_ = 0x3f147ae13f147ae1;
  auVar7._12_4_ = 0x3f147ae1;
  local_48 = vmovlps_avx(auVar7);
  local_40 = 0x3f19999a;
  auVar4 = ZEXT416((uint)(auVar5._0_4_ * 6.0));
  auVar4 = vroundss_avx(auVar4,auVar4,9);
  iVar3 = 5;
  if ((int)auVar4._0_4_ < 5) {
    iVar3 = (int)auVar4._0_4_;
  }
  auVar18._0_4_ = (float)iVar3;
  auVar18._4_12_ = in_register_000012c4;
  auVar4 = vfmsub231ss_fma(auVar18,SUB6416(ZEXT464(0x40c00000),0),auVar5);
  FVar17 = auVar4._0_4_;
  auVar16 = ZEXT856(auVar4._8_8_);
  RVar20 = Lerp(FVar17,(RGB *)(local_a8 + (long)iVar3 * 0xc),
                (RGB *)(local_a8 + (long)(iVar3 + 1) * 0xc));
  local_120 = RVar20.b;
  auVar10._0_8_ = RVar20._0_8_;
  auVar10._8_56_ = auVar16;
  local_128 = (undefined8 *)vmovlps_avx(auVar10._0_16_);
  auVar16 = (undefined1  [56])0x0;
  RVar20 = Lerp(FVar17,(RGB *)(local_a8 + (long)(iVar3 + 1) * 0xc),
                (RGB *)(local_a8 + (long)(iVar3 + 2) * 0xc));
  local_d8.b = RVar20.b;
  auVar11._0_8_ = RVar20._0_8_;
  auVar11._8_56_ = auVar16;
  local_d8._0_8_ = vmovlps_avx(auVar11._0_16_);
  auVar16 = (undefined1  [56])0x0;
  RVar20 = Lerp(FVar17,(RGB *)(local_a8 + (long)(iVar3 + 2) * 0xc),
                (RGB *)(local_a8 + (long)(iVar3 + 3) * 0xc));
  local_e8.b = RVar20.b;
  auVar12._0_8_ = RVar20._0_8_;
  auVar12._8_56_ = auVar16;
  local_e8._0_8_ = vmovlps_avx(auVar12._0_16_);
  auVar16 = (undefined1  [56])0x0;
  RVar20 = Lerp(FVar17,(RGB *)&local_128,&local_d8);
  local_120 = RVar20.b;
  auVar13._0_8_ = RVar20._0_8_;
  auVar13._8_56_ = auVar16;
  local_128 = (undefined8 *)vmovlps_avx(auVar13._0_16_);
  auVar16 = (undefined1  [56])0x0;
  RVar20 = Lerp(FVar17,&local_d8,&local_e8);
  local_d8.b = RVar20.b;
  auVar14._0_8_ = RVar20._0_8_;
  auVar14._8_56_ = auVar16;
  local_d8._0_8_ = vmovlps_avx(auVar14._0_16_);
  auVar16 = (undefined1  [56])0x0;
  RVar20 = Lerp(FVar17,(RGB *)&local_128,&local_d8);
  auVar15._0_8_ = RVar20._0_8_;
  auVar15._8_56_ = auVar16;
  auVar2._8_4_ = 0x3fc00000;
  auVar2._0_8_ = 0x3fc000003fc00000;
  auVar2._12_4_ = 0x3fc00000;
  auVar4 = vmulps_avx512vl(auVar15._0_16_,auVar2);
  local_120 = RVar20.b * 1.5;
  local_128 = (undefined8 *)vmovlps_avx(auVar4);
  RGBReflectanceSpectrum::RGBReflectanceSpectrum
            ((RGBReflectanceSpectrum *)local_108,RGBColorSpace::sRGB,(RGB *)&local_128);
  SVar21 = RGBReflectanceSpectrum::Sample((RGBReflectanceSpectrum *)local_108,&lambda);
  return (array<float,_4>)(array<float,_4>)SVar21;
}

Assistant:

SampledSpectrum MarbleTexture::Evaluate(TextureEvalContext ctx,
                                        SampledWavelengths lambda) const {
    Vector3f dpdx, dpdy;
    Point3f p = mapping.Map(ctx, &dpdx, &dpdy);
    p *= scale;
    Float marble = p.y + variation * FBm(p, scale * dpdx, scale * dpdy, omega, octaves);
    Float t = .5f + .5f * std::sin(marble);
    // Evaluate marble spline at _t_
    const RGB c[] = {
        {.58f, .58f, .6f}, {.58f, .58f, .6f}, {.58f, .58f, .6f},
        {.5f, .5f, .5f},   {.6f, .59f, .58f}, {.58f, .58f, .6f},
        {.58f, .58f, .6f}, {.2f, .2f, .33f},  {.58f, .58f, .6f},
    };
    int nSeg = PBRT_ARRAYSIZE(c) - 3;
    int first = std::min<int>(std::floor(t * nSeg), nSeg - 1);
    t = (t * nSeg - first);
    // Bezier spline evaluated with de Castilejau's algorithm
    RGB s0 = Lerp(t, c[first], c[first + 1]);
    RGB s1 = Lerp(t, c[first + 1], c[first + 2]);
    RGB s2 = Lerp(t, c[first + 2], c[first + 3]);
    s0 = Lerp(t, s0, s1);
    s1 = Lerp(t, s1, s2);
    // Extra scale of 1.5 to increase variation among colors
    s0 = 1.5f * Lerp(t, s0, s1);
#ifdef PBRT_IS_GPU_CODE
    return RGBReflectanceSpectrum(*RGBColorSpace_sRGB, s0).Sample(lambda);
#else
    return RGBReflectanceSpectrum(*RGBColorSpace::sRGB, s0).Sample(lambda);
#endif
}